

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 fts5IndexDataVersion(Fts5Index *p)

{
  int iVar1;
  char *zSql;
  sqlite3_int64 local_20;
  i64 iVersion;
  Fts5Index *p_local;
  
  local_20 = 0;
  if (p->rc == 0) {
    if (p->pDataVersion == (sqlite3_stmt *)0x0) {
      zSql = sqlite3_mprintf("PRAGMA %Q.data_version",p->pConfig->zDb);
      iVar1 = fts5IndexPrepareStmt(p,&p->pDataVersion,zSql);
      p->rc = iVar1;
      if (p->rc != 0) {
        return 0;
      }
    }
    iVar1 = sqlite3_step(p->pDataVersion);
    if (iVar1 == 100) {
      local_20 = sqlite3_column_int64(p->pDataVersion,0);
    }
    iVar1 = sqlite3_reset(p->pDataVersion);
    p->rc = iVar1;
  }
  return local_20;
}

Assistant:

static i64 fts5IndexDataVersion(Fts5Index *p){
  i64 iVersion = 0;

  if( p->rc==SQLITE_OK ){
    if( p->pDataVersion==0 ){
      p->rc = fts5IndexPrepareStmt(p, &p->pDataVersion, 
          sqlite3_mprintf("PRAGMA %Q.data_version", p->pConfig->zDb)
          );
      if( p->rc ) return 0;
    }

    if( SQLITE_ROW==sqlite3_step(p->pDataVersion) ){
      iVersion = sqlite3_column_int64(p->pDataVersion, 0);
    }
    p->rc = sqlite3_reset(p->pDataVersion);
  }

  return iVersion;
}